

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  bool bVar2;
  char *lhs;
  string c;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  char *local_60 [4];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             FLAGS_gtest_color_abi_cxx11_);
  bVar1 = String::CaseInsensitiveCStringEquals(local_60[0],"auto");
  if (bVar1) {
    lhs = getenv("TERM");
    if (lhs == (char *)0x0) {
      bVar2 = false;
    }
    else {
      bVar1 = String::CStringEquals(lhs,"xterm");
      bVar2 = true;
      if (!bVar1) {
        bVar1 = String::CStringEquals(lhs,"xterm-color");
        if (!bVar1) {
          bVar1 = String::CStringEquals(lhs,"xterm-kitty");
          if (!bVar1) {
            bVar1 = String::CStringEquals(lhs,"alacritty");
            if (!bVar1) {
              bVar1 = String::CStringEquals(lhs,"screen");
              if (!bVar1) {
                bVar1 = String::CStringEquals(lhs,"tmux");
                if (!bVar1) {
                  bVar1 = String::CStringEquals(lhs,"rxvt-unicode");
                  if (!bVar1) {
                    bVar1 = String::CStringEquals(lhs,"linux");
                    if (!bVar1) {
                      bVar1 = String::CStringEquals(lhs,"cygwin");
                      if (!bVar1) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_80,lhs,&local_81);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_40,"-256color",&local_82);
                        bVar2 = String::EndsWithCaseInsensitive(&local_80,&local_40);
                        std::__cxx11::string::~string((string *)&local_40);
                        std::__cxx11::string::~string((string *)&local_80);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar2 = (bool)(stdout_is_tty & bVar2);
  }
  else {
    bVar1 = String::CaseInsensitiveCStringEquals(local_60[0],"yes");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = String::CaseInsensitiveCStringEquals(local_60[0],"true");
      if (!bVar1) {
        bVar1 = String::CaseInsensitiveCStringEquals(local_60[0],"t");
        if (!bVar1) {
          bVar2 = String::CStringEquals(local_60[0],"1");
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  return bVar2;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "alacritty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}